

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

void do_abort_waiting_for_dialog_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value local_40;
  Am_Object local_30 [3];
  Am_Object local_18;
  Am_Object widget;
  Am_Object *cmd_local;
  
  widget.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)cmd);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    Am_Object::Am_Object(local_30,&local_18);
    Am_Value::Am_Value(&local_40,0);
    Am_Finish_Pop_Up_Waiting(local_30,&local_40);
    Am_Value::~Am_Value(&local_40);
    Am_Object::~Am_Object(local_30);
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_abort_waiting_for_dialog,
                 (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner();
  if (widget.Valid())
    Am_Finish_Pop_Up_Waiting(widget, (0L));
}